

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clause.cpp
# Opt level: O3

bool __thiscall Kernel::Clause::isHorn(Clause *this)

{
  ulong uVar1;
  bool bVar2;
  uint uVar3;
  long lVar4;
  byte bVar5;
  bool bVar6;
  
  uVar3 = *(uint *)&this->field_0x38 & 0xfffff;
  if (uVar3 == 0) {
    bVar2 = true;
  }
  else {
    lVar4 = 0;
    bVar5 = 0;
    do {
      uVar1 = (this->_literals[lVar4]->super_Term)._args[0]._content;
      bVar6 = (uVar1 & 4) == 0;
      bVar2 = (bool)(bVar5 ^ 1 | bVar6);
      if ((bVar5 ^ 1) == 0 && !bVar6) {
        return bVar2;
      }
      bVar5 = (byte)(((uint)uVar1 & 4) >> 2) | bVar5;
      lVar4 = lVar4 + 1;
    } while ((uint)lVar4 < uVar3);
  }
  return bVar2;
}

Assistant:

bool Clause::isHorn()
{
  bool posFound=false;
  for (Literal* l : iterLits()) {
    if (l->isPositive()) {
      if (posFound) {
        return false;
      }
      else {
        posFound=true;
      }
    }
  }
  return true;
}